

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::loops_plusloop_check(Forth *this)

{
  uint Value;
  uint uVar1;
  uint uVar2;
  uint x;
  int local_44;
  uint local_38;
  SCell result;
  int compare;
  int signIncrement;
  int signNewIndex;
  int signIndex;
  SCell newIndex;
  SCell limitMinus1;
  SCell increment;
  SCell index;
  SCell limit;
  Forth *this_local;
  
  requireRStackDepth(this,2,"plusloop_check");
  requireDStackDepth(this,1,"plusloop_check");
  requireDStackAvailable(this,2,"plusloop_check");
  Value = ForthStack<unsigned_int>::getTop(&this->rStack);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->rStack,1);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (Value == 0x80000000) {
    local_44 = -0x80000000;
  }
  else {
    local_44 = Value - 1;
  }
  x = uVar1 + uVar2;
  local_38 = 0;
  if (loops_plusloop_check::conditions[(int)(uint)((int)uVar2 < 1)][(int)(uint)((int)uVar1 < 1)]
      [(int)(uint)((int)x < 1)] == 1) {
    if ((((int)uVar1 <= local_44) && ((int)Value <= (int)x)) ||
       (((int)x <= local_44 && ((int)Value <= (int)uVar1)))) {
      local_38 = 0xffffffff;
    }
  }
  else if (((local_44 < (int)uVar1) || ((int)x < (int)Value)) &&
          ((local_44 < (int)x || ((int)uVar1 < (int)Value)))) {
    local_38 = 0xffffffff;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  ForthStack<unsigned_int>::push(&this->dStack,x);
  ForthStack<unsigned_int>::push(&this->dStack,local_38);
  ForthStack<unsigned_int>::pop(&this->rStack);
  ForthStack<unsigned_int>::pop(&this->rStack);
  return;
}

Assistant:

void loops_plusloop_check() {
			// conditions : first index is the sign of increment (0 => +, 1 => -)
			// second index is the sign of index  (0 => +, 1 => -)
			// third index is the sign of newIndex  (0 => +, 1 => -)
			// value: 1 - compare as usual, 0 - compare considering integer overflow
			static int conditions[2][2][2] = { 
				{ { 1, 0 }, { 1, 1 }}, // positive increment
				{ { 1, 1 }, { 0, 1 }}  // negative increment
			};
			REQUIRE_RSTACK_DEPTH(2, "plusloop_check");
			REQUIRE_DSTACK_DEPTH(1, "plusloop_check");
			REQUIRE_DSTACK_AVAILABLE(2, "plusloop_check");
    		SCell limit = static_cast<SCell>(rStack.getTop()); // limit of loop
			SCell index = static_cast<SCell>(rStack.getTop(1)); // current index of loop
			SCell increment = static_cast<SCell>(dStack.getTop()); // increment of loop from stack
			SCell limitMinus1 = limit==0x80000000?limit:limit - 1;   // limit and limit-1 - the border to cross as exit test for loop
			SCell newIndex = index + increment; // if newIndex crossed the border, than the loop is finished
			int signIndex = index > 0 ? 0 : 1;
			int signNewIndex = newIndex > 0 ? 0 : 1;
			int signIncrement = increment > 0 ? 0 : 1;
			int compare = conditions[signIncrement][signIndex][signNewIndex];
			SCell result = 0;
			if (compare == 1){
				if (((index <= limitMinus1) && (newIndex >= limit)) || ((newIndex <= limitMinus1) && (index >= limit))){
					result = -1;
				}
			}
			else {
				if (!(((index <= limitMinus1) && (newIndex >= limit)) || ((newIndex <= limitMinus1) && (index >= limit)))){
					result = -1;
				}
			}
			dStack.setTop(static_cast<SCell>(limit));
			dStack.push(static_cast<SCell>(newIndex));
			dStack.push(result);
			rStack.pop();
			rStack.pop();
		}